

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void groupConcatFinalize(sqlite3_context *context)

{
  StrAccum *p;
  char *z;
  
  if ((context->pMem->flags & 0x2000) == 0) {
    p = (StrAccum *)createAggContext(context,0);
  }
  else {
    p = (StrAccum *)context->pMem->z;
  }
  if (p == (StrAccum *)0x0) {
    return;
  }
  if (p->accError == '\x01') {
    sqlite3_result_error_nomem(context);
    return;
  }
  if (p->accError == '\x02') {
    context->isError = 0x12;
    context->fErrorOrAux = '\x01';
    sqlite3VdbeMemSetStr
              (context->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
    return;
  }
  z = sqlite3StrAccumFinish(p);
  setResultStrOrError(context,z,-1,'\x01',sqlite3_free);
  return;
}

Assistant:

static void groupConcatFinalize(sqlite3_context *context){
  StrAccum *pAccum;
  pAccum = sqlite3_aggregate_context(context, 0);
  if( pAccum ){
    if( pAccum->accError==STRACCUM_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==STRACCUM_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else{    
      sqlite3_result_text(context, sqlite3StrAccumFinish(pAccum), -1, 
                          sqlite3_free);
    }
  }
}